

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KNNValidatorTests.cpp
# Opt level: O3

void CoreML::KNNValidatorTests::addIntLabels(KNearestNeighborsClassifier *nnModel)

{
  Int64Vector *pIVar1;
  int iVar2;
  
  if (nnModel->_oneof_case_[0] == 0x65) {
    pIVar1 = (nnModel->ClassLabels_).int64classlabels_;
  }
  else {
    Specification::KNearestNeighborsClassifier::clear_ClassLabels(nnModel);
    nnModel->_oneof_case_[0] = 0x65;
    pIVar1 = (Int64Vector *)operator_new(0x28);
    Specification::Int64Vector::Int64Vector(pIVar1);
    (nnModel->ClassLabels_).int64classlabels_ = pIVar1;
  }
  iVar2 = (pIVar1->vector_).current_size_;
  if (iVar2 == (pIVar1->vector_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(&pIVar1->vector_,iVar2 + 1);
    iVar2 = (pIVar1->vector_).current_size_;
  }
  (pIVar1->vector_).current_size_ = iVar2 + 1;
  ((pIVar1->vector_).rep_)->elements[iVar2] = 0;
  if (nnModel->_oneof_case_[0] == 0x65) {
    pIVar1 = (nnModel->ClassLabels_).int64classlabels_;
  }
  else {
    Specification::KNearestNeighborsClassifier::clear_ClassLabels(nnModel);
    nnModel->_oneof_case_[0] = 0x65;
    pIVar1 = (Int64Vector *)operator_new(0x28);
    Specification::Int64Vector::Int64Vector(pIVar1);
    (nnModel->ClassLabels_).int64classlabels_ = pIVar1;
  }
  iVar2 = (pIVar1->vector_).current_size_;
  if (iVar2 == (pIVar1->vector_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(&pIVar1->vector_,iVar2 + 1);
    iVar2 = (pIVar1->vector_).current_size_;
  }
  (pIVar1->vector_).current_size_ = iVar2 + 1;
  ((pIVar1->vector_).rep_)->elements[iVar2] = 0;
  if (nnModel->_oneof_case_[0] == 0x65) {
    pIVar1 = (nnModel->ClassLabels_).int64classlabels_;
  }
  else {
    Specification::KNearestNeighborsClassifier::clear_ClassLabels(nnModel);
    nnModel->_oneof_case_[0] = 0x65;
    pIVar1 = (Int64Vector *)operator_new(0x28);
    Specification::Int64Vector::Int64Vector(pIVar1);
    (nnModel->ClassLabels_).int64classlabels_ = pIVar1;
  }
  iVar2 = (pIVar1->vector_).current_size_;
  if (iVar2 == (pIVar1->vector_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(&pIVar1->vector_,iVar2 + 1);
    iVar2 = (pIVar1->vector_).current_size_;
  }
  (pIVar1->vector_).current_size_ = iVar2 + 1;
  ((pIVar1->vector_).rep_)->elements[iVar2] = 0;
  if (nnModel->_oneof_case_[0] == 0x65) {
    pIVar1 = (nnModel->ClassLabels_).int64classlabels_;
  }
  else {
    Specification::KNearestNeighborsClassifier::clear_ClassLabels(nnModel);
    nnModel->_oneof_case_[0] = 0x65;
    pIVar1 = (Int64Vector *)operator_new(0x28);
    Specification::Int64Vector::Int64Vector(pIVar1);
    (nnModel->ClassLabels_).int64classlabels_ = pIVar1;
  }
  iVar2 = (pIVar1->vector_).current_size_;
  if (iVar2 == (pIVar1->vector_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(&pIVar1->vector_,iVar2 + 1);
    iVar2 = (pIVar1->vector_).current_size_;
  }
  (pIVar1->vector_).current_size_ = iVar2 + 1;
  ((pIVar1->vector_).rep_)->elements[iVar2] = 0;
  if (nnModel->_oneof_case_[0] == 0x65) {
    pIVar1 = (nnModel->ClassLabels_).int64classlabels_;
  }
  else {
    Specification::KNearestNeighborsClassifier::clear_ClassLabels(nnModel);
    nnModel->_oneof_case_[0] = 0x65;
    pIVar1 = (Int64Vector *)operator_new(0x28);
    Specification::Int64Vector::Int64Vector(pIVar1);
    (nnModel->ClassLabels_).int64classlabels_ = pIVar1;
  }
  iVar2 = (pIVar1->vector_).current_size_;
  if (iVar2 == (pIVar1->vector_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(&pIVar1->vector_,iVar2 + 1);
    iVar2 = (pIVar1->vector_).current_size_;
  }
  (pIVar1->vector_).current_size_ = iVar2 + 1;
  ((pIVar1->vector_).rep_)->elements[iVar2] = 0;
  if (nnModel->_oneof_case_[0] == 0x65) {
    pIVar1 = (nnModel->ClassLabels_).int64classlabels_;
  }
  else {
    Specification::KNearestNeighborsClassifier::clear_ClassLabels(nnModel);
    nnModel->_oneof_case_[0] = 0x65;
    pIVar1 = (Int64Vector *)operator_new(0x28);
    Specification::Int64Vector::Int64Vector(pIVar1);
    (nnModel->ClassLabels_).int64classlabels_ = pIVar1;
  }
  iVar2 = (pIVar1->vector_).current_size_;
  if (iVar2 == (pIVar1->vector_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(&pIVar1->vector_,iVar2 + 1);
    iVar2 = (pIVar1->vector_).current_size_;
  }
  (pIVar1->vector_).current_size_ = iVar2 + 1;
  ((pIVar1->vector_).rep_)->elements[iVar2] = 0;
  return;
}

Assistant:

void addIntLabels(Specification::KNearestNeighborsClassifier* nnModel) {

        nnModel->mutable_int64classlabels()->add_vector(0);
        nnModel->mutable_int64classlabels()->add_vector(0);
        nnModel->mutable_int64classlabels()->add_vector(0);

        nnModel->mutable_int64classlabels()->add_vector(0);
        nnModel->mutable_int64classlabels()->add_vector(0);
        nnModel->mutable_int64classlabels()->add_vector(0);

    }